

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

intptr_t http_listen(char *port,char *binding,http_settings_s arg_settings)

{
  fio_listen_args args;
  http_settings_s arg_settings_00;
  http_settings_s *phVar1;
  intptr_t iVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60 [72];
  
  if (arg_settings.on_request != (_func_void_http_s_ptr *)0x0) {
    phVar1 = &arg_settings;
    puVar4 = (undefined8 *)&stack0xffffffffffffff28;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar4 = phVar1->on_request;
      phVar1 = (http_settings_s *)&phVar1->on_upgrade;
      puVar4 = puVar4 + 1;
    }
    arg_settings_00.on_upgrade = (_func_void_http_s_ptr_char_ptr_size_t *)in_stack_ffffffffffffff30;
    arg_settings_00.on_request = (_func_void_http_s_ptr *)in_stack_ffffffffffffff28;
    arg_settings_00.on_response = (_func_void_http_s_ptr *)in_stack_ffffffffffffff38;
    arg_settings_00.on_finish = (_func_void_http_settings_s_ptr *)in_stack_ffffffffffffff40;
    arg_settings_00.udata = (void *)in_stack_ffffffffffffff48;
    arg_settings_00.public_folder = (char *)in_stack_ffffffffffffff50;
    arg_settings_00.public_folder_length = in_stack_ffffffffffffff58;
    arg_settings_00.max_header_size = in_stack_ffffffffffffff60._0_8_;
    arg_settings_00.max_body_size = in_stack_ffffffffffffff60._8_8_;
    arg_settings_00.max_clients = in_stack_ffffffffffffff60._16_8_;
    arg_settings_00.tls = (void *)in_stack_ffffffffffffff60._24_8_;
    arg_settings_00.reserved1 = in_stack_ffffffffffffff60._32_8_;
    arg_settings_00.reserved2 = in_stack_ffffffffffffff60._40_8_;
    arg_settings_00.reserved3 = in_stack_ffffffffffffff60._48_8_;
    arg_settings_00.ws_max_msg_size = in_stack_ffffffffffffff60._56_8_;
    arg_settings_00.timeout = in_stack_ffffffffffffff60[0x40];
    arg_settings_00.ws_timeout = in_stack_ffffffffffffff60[0x41];
    arg_settings_00.log = in_stack_ffffffffffffff60[0x42];
    arg_settings_00.is_client = in_stack_ffffffffffffff60[0x43];
    arg_settings_00._124_4_ = in_stack_ffffffffffffff60._68_4_;
    phVar1 = http_settings_new(arg_settings_00);
    phVar1->is_client = '\0';
    if (phVar1->tls != (void *)0x0) {
      fio_tls_alpn_add(phVar1->tls,"http/1.1",http_on_server_protocol_http1,(void *)0x0,
                       (_func_void_void_ptr *)0x0);
    }
    args.port = port;
    args.on_open = http_on_open;
    args.address = binding;
    args.tls = arg_settings.tls;
    args.udata = phVar1;
    args.on_start = (_func_void_intptr_t_void_ptr *)0x0;
    args.on_finish = http_on_finish;
    iVar2 = fio_listen(args);
    return iVar2;
  }
  if (1 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("ERROR: http_listen requires the .on_request parameter to be set\n");
  }
  kill(0,2);
  exit(0xb);
}

Assistant:

intptr_t http_listen(const char *port, const char *binding,
                     struct http_settings_s arg_settings) {
  if (arg_settings.on_request == NULL) {
    FIO_LOG_ERROR("http_listen requires the .on_request parameter "
                  "to be set\n");
    kill(0, SIGINT);
    exit(11);
  }

  http_settings_s *settings = http_settings_new(arg_settings);
  settings->is_client = 0;
  if (settings->tls) {
    fio_tls_alpn_add(settings->tls, "http/1.1", http_on_server_protocol_http1,
                     NULL, NULL);
  }

  return fio_listen(.port = port, .address = binding, .tls = arg_settings.tls,
                    .on_finish = http_on_finish, .on_open = http_on_open,
                    .udata = settings);
}